

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beectl.c
# Opt level: O0

char * get_text_prop(cJSON *value,uint *value_len,char *key)

{
  cJSON_bool cVar1;
  cJSON *item;
  char *pcVar2;
  size_t sVar3;
  cJSON *text_obj;
  char *text;
  char *key_local;
  uint *value_len_local;
  cJSON *value_local;
  
  if ((value == (cJSON *)0x0) || (cVar1 = cJSON_IsObject(value), cVar1 == 0)) {
    return (char *)0x0;
  }
  item = cJSON_GetObjectItemCaseSensitive(value,key);
  if ((item != (cJSON *)0x0) && (cVar1 = cJSON_IsString(item), cVar1 != 0)) {
    pcVar2 = cJSON_GetStringValue(item);
    if (pcVar2 == (char *)0x0) {
      return (char *)0x0;
    }
    sVar3 = strlen(pcVar2);
    *value_len = (uint)sVar3;
    pcVar2 = strndup(pcVar2,(ulong)*value_len);
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

static char *
get_text_prop (const cJSON *value, unsigned int *value_len, const char* key)
{
  char *text = NULL;
  cJSON *text_obj = NULL;

  if (unlikely (value == NULL || !cJSON_IsObject (value)))
    return NULL;

  text_obj = cJSON_GetObjectItemCaseSensitive (value, key);
  if (text_obj == NULL || !cJSON_IsString (text_obj))
    return NULL;

  text = cJSON_GetStringValue (text_obj);
  if (text == NULL)
    return NULL;

  *value_len = strlen (text);
  return strndup (text, *value_len);
}